

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::NetStrengthSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((kind == ChargeStrength) || (kind == DriveStrength)) || (kind == PullStrength)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool NetStrengthSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ChargeStrength:
        case SyntaxKind::DriveStrength:
        case SyntaxKind::PullStrength:
            return true;
        default:
            return false;
    }
}